

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xml.c
# Opt level: O1

void xml_parser_error(xml_parser *parser,xml_parser_offset offset,char *message)

{
  ulong uVar1;
  int iVar2;
  ulong uVar3;
  ulong uVar4;
  bool bVar5;
  
  uVar4 = (long)offset + parser->position;
  if (parser->length < uVar4) {
    uVar4 = parser->length;
  }
  if (uVar4 == 0) {
    uVar3 = 1;
    uVar1 = 0;
  }
  else {
    uVar3 = 0;
    iVar2 = 0;
    uVar1 = 0;
    do {
      bVar5 = parser->buffer[uVar3] == '\n';
      uVar1 = (ulong)((int)uVar1 + 1);
      if (bVar5) {
        uVar1 = 0;
      }
      iVar2 = iVar2 + (uint)bVar5;
      uVar3 = uVar3 + 1;
    } while (uVar4 != uVar3);
    uVar3 = (ulong)(iVar2 + 1);
  }
  if (offset == NO_CHARACTER) {
    fprintf(_stderr,"xml_parser_error at %i:%i: %s\n",uVar3,uVar1,message);
    return;
  }
  fprintf(_stderr,"xml_parser_error at %i:%i (is %c): %s\n",uVar3,uVar1,(ulong)parser->buffer[uVar4]
         );
  return;
}

Assistant:

static void xml_parser_error(struct xml_parser* parser, enum xml_parser_offset offset, char const* message) {
	int row = 0;
	int column = 0;

	#define min(X,Y) ((X) < (Y) ? (X) : (Y))
	#define max(X,Y) ((X) > (Y) ? (X) : (Y))
	size_t character = max(0, min(parser->length, parser->position + offset));
	#undef min
	#undef max

	size_t position = 0; for (; position < character; ++position) {
		column++;

		if ('\n' == parser->buffer[position]) {
			row++;
			column = 0;
		}
	}

	if (NO_CHARACTER != offset) {
		fprintf(stderr,	"xml_parser_error at %i:%i (is %c): %s\n",
				row + 1, column, parser->buffer[character], message
		);
	} else {
		fprintf(stderr,	"xml_parser_error at %i:%i: %s\n",
				row + 1, column, message
		);
	}
}